

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v5::vprint(FILE *f,string_view format_str,format_args args)

{
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  char *__ptr;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this;
  unsigned_long_long in_RDX;
  basic_buffer<char> *in_RSI;
  FILE *in_RDI;
  memory_buffer buffer;
  allocator<char> *in_stack_fffffffffffffd68;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_2
  in_stack_fffffffffffffda8;
  basic_string_view<char> in_stack_fffffffffffffdb0;
  basic_buffer<char> local_240 [16];
  FILE *local_28;
  basic_buffer<char> *local_10;
  unsigned_long_long uStack_8;
  
  local_28 = in_RDI;
  local_10 = in_RSI;
  uStack_8 = in_RDX;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdbf);
  args_00.field_1.args_ = in_stack_fffffffffffffda8.args_;
  args_00.types_ = uStack_8;
  internal::vformat_to<char>(local_10,in_stack_fffffffffffffdb0,args_00);
  __ptr = internal::basic_buffer<char>::data(local_240);
  this = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
         internal::basic_buffer<char>::size(local_240);
  fwrite(__ptr,1,(size_t)this,local_28);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this);
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE *f, string_view format_str, format_args args) {
  memory_buffer buffer;
  internal::vformat_to(buffer, format_str,
                       basic_format_args<buffer_context<char>::type>(args));
  std::fwrite(buffer.data(), 1, buffer.size(), f);
}